

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

int deqp::gls::ub::anon_unknown_12::computeStd140BaseAlignment(VarType *type)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  DataType DVar4;
  uint uVar5;
  pointer pSVar6;
  
  if (type->m_type == TYPE_ARRAY) {
    uVar2 = computeStd140BaseAlignment((type->m_data).array.elementType);
    uVar5 = uVar2 + 0xf;
    if (-1 < (int)uVar2) {
      uVar5 = uVar2;
    }
    uVar3 = (uVar5 & 0xfffffff0) + 0x10;
    if ((uVar5 & 0xfffffff0) == uVar2) {
      uVar3 = uVar2;
    }
  }
  else if (type->m_type == TYPE_BASIC) {
    DVar4 = (type->m_data).basicType;
    if (DVar4 - TYPE_FLOAT_MAT2 < 9 || DVar4 - TYPE_DOUBLE_MAT2 < 9) {
      if ((type->m_flags & 0x40) == 0) {
        iVar1 = glu::getDataTypeMatrixNumRows(DVar4);
      }
      else {
        iVar1 = glu::getDataTypeMatrixNumColumns(DVar4);
      }
      DVar4 = glu::getDataTypeFloatVec(iVar1);
      iVar1 = glu::getDataTypeScalarSize(DVar4);
      uVar3 = iVar1 * 4;
      if (iVar1 * 4 < 0x11) {
        uVar3 = 0x10;
      }
    }
    else {
      uVar3 = 0;
      if (DVar4 - TYPE_FLOAT < 0x26) {
        uVar3 = *(uint *)(&DAT_009cddfc + (ulong)(DVar4 - TYPE_FLOAT) * 4);
      }
    }
  }
  else {
    pSVar6 = (((type->m_data).structPtr)->m_members).
             super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar6 == (((type->m_data).structPtr)->m_members).
                  super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        uVar2 = computeStd140BaseAlignment(&pSVar6->m_type);
        if ((int)uVar2 < (int)uVar5) {
          uVar2 = uVar5;
        }
        uVar5 = uVar2;
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != (((type->m_data).structPtr)->m_members).
                         super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    uVar3 = (uVar5 & 0xfffffff0) + 0x10;
    if ((uVar5 & 0xfffffff0) == uVar5) {
      uVar3 = uVar5;
    }
  }
  return uVar3;
}

Assistant:

int computeStd140BaseAlignment (const VarType& type)
{
	const int vec4Alignment = (int)sizeof(deUint32)*4;

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			bool	isRowMajor	= !!(type.getFlags() & LAYOUT_ROW_MAJOR);
			int		vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
											 : glu::getDataTypeMatrixNumRows(basicType);

			return getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		int elemAlignment = computeStd140BaseAlignment(type.getElementType());

		// Round up to alignment of vec4
		return deRoundUp32(elemAlignment, vec4Alignment);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd140BaseAlignment(memberIter->getType()));

		return deRoundUp32(maxBaseAlignment, vec4Alignment);
	}
}